

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

void altar_wrath(int x,int y)

{
  int iVar1;
  char *pcVar2;
  char *__s2;
  char local_1c;
  aligntyp local_18;
  aligntyp altaralign;
  int y_local;
  int x_local;
  
  if ((*(uint *)&level->locations[x][y].field_0x6 >> 4 & 7) == 0) {
    local_18 = -0x80;
  }
  else {
    if ((*(uint *)&level->locations[x][y].field_0x6 >> 4 & 7) == 4) {
      local_1c = '\x01';
    }
    else {
      local_1c = ((byte)(*(uint *)&level->locations[x][y].field_0x6 >> 4) & 7) - 2;
    }
    local_18 = local_1c;
  }
  pcVar2 = align_gname(local_18);
  __s2 = u_gname();
  iVar1 = strcmp(pcVar2,__s2);
  if (iVar1 == 0) {
    godvoice(local_18,"How darest thou desecrate my altar!");
    adjattrib(2,-1,'\0',0);
  }
  else {
    pcVar2 = align_gname(local_18);
    pline("A voice (could it be %s?) whispers:",pcVar2);
    verbalize("Thou shalt pay, infidel!");
    change_luck(-1);
  }
  return;
}

Assistant:

void altar_wrath(int x, int y)
{
    aligntyp altaralign = a_align(x,y);

    if (!strcmp(align_gname(altaralign), u_gname())) {
	godvoice(altaralign, "How darest thou desecrate my altar!");
	adjattrib(A_WIS, -1, FALSE, 0);
    } else {
	pline("A voice (could it be %s?) whispers:",
	      align_gname(altaralign));
	verbalize("Thou shalt pay, infidel!");
	change_luck(-1);
    }
}